

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_16777232,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMiMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Scene *pSVar11;
  Ref<embree::Geometry> *pRVar12;
  Geometry *pGVar13;
  long lVar14;
  long lVar15;
  RTCFilterFunctionN p_Var16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  byte bVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  AABBNodeMB4D *node1;
  ulong uVar34;
  long lVar35;
  uint uVar36;
  int iVar37;
  ulong uVar38;
  long lVar39;
  long lVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  long lVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  bool bVar51;
  bool bVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [64];
  undefined1 auVar69 [16];
  undefined1 auVar70 [64];
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [64];
  float fVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  float fVar78;
  float fVar79;
  float fVar80;
  undefined1 auVar77 [64];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [64];
  undefined1 auVar84 [16];
  uint uVar86;
  uint uVar87;
  uint uVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  undefined1 auVar85 [64];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [64];
  undefined1 auVar96 [16];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [64];
  undefined1 auVar100 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [16];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  undefined1 local_1780 [16];
  undefined1 (*local_1768) [16];
  ulong local_1760;
  ulong local_1758;
  ulong *local_1750;
  long local_1748;
  long local_1740;
  ulong local_1738;
  ulong local_1730;
  long local_1728;
  ulong local_1720;
  ulong local_1718;
  ulong local_1710;
  ulong local_1708;
  ulong local_1700;
  ulong local_16f8;
  RTCFilterFunctionNArguments local_16f0;
  undefined1 local_16c0 [32];
  undefined1 local_16a0 [16];
  undefined1 local_1690 [16];
  undefined1 local_1680 [16];
  undefined1 local_1670 [16];
  undefined1 local_1660 [16];
  undefined1 local_1650 [16];
  undefined1 local_1640 [16];
  undefined1 local_1630 [16];
  undefined1 local_1620 [16];
  RTCHitN local_1610 [16];
  undefined1 local_1600 [16];
  undefined1 local_15f0 [16];
  undefined4 local_15e0;
  undefined4 uStack_15dc;
  undefined4 uStack_15d8;
  undefined4 uStack_15d4;
  undefined1 local_15d0 [16];
  undefined1 local_15c0 [16];
  undefined1 local_15b0 [16];
  uint local_15a0;
  uint uStack_159c;
  uint uStack_1598;
  uint uStack_1594;
  uint uStack_1590;
  uint uStack_158c;
  uint uStack_1588;
  uint uStack_1584;
  undefined1 local_1580 [32];
  undefined1 local_1560 [32];
  undefined1 local_1540 [32];
  undefined1 local_1520 [32];
  undefined1 local_1500 [32];
  undefined1 local_14e0 [32];
  undefined1 local_14c0 [32];
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined4 local_1440;
  undefined4 uStack_143c;
  undefined4 uStack_1438;
  undefined4 uStack_1434;
  undefined4 uStack_1430;
  undefined4 uStack_142c;
  undefined4 uStack_1428;
  undefined4 uStack_1424;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  float local_12a0 [4];
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  float fStack_1284;
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  size_t local_1200;
  ulong local_11f8 [569];
  
  local_1750 = local_11f8;
  local_1200 = root.ptr;
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_1460._4_4_ = fVar1;
  local_1460._0_4_ = fVar1;
  local_1460._8_4_ = fVar1;
  local_1460._12_4_ = fVar1;
  local_1460._16_4_ = fVar1;
  local_1460._20_4_ = fVar1;
  local_1460._24_4_ = fVar1;
  local_1460._28_4_ = fVar1;
  auVar68 = ZEXT3264(local_1460);
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_1480._4_4_ = fVar2;
  local_1480._0_4_ = fVar2;
  local_1480._8_4_ = fVar2;
  local_1480._12_4_ = fVar2;
  local_1480._16_4_ = fVar2;
  local_1480._20_4_ = fVar2;
  local_1480._24_4_ = fVar2;
  local_1480._28_4_ = fVar2;
  auVar70 = ZEXT3264(local_1480);
  fVar89 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_14a0._4_4_ = fVar89;
  local_14a0._0_4_ = fVar89;
  local_14a0._8_4_ = fVar89;
  local_14a0._12_4_ = fVar89;
  local_14a0._16_4_ = fVar89;
  local_14a0._20_4_ = fVar89;
  local_14a0._24_4_ = fVar89;
  local_14a0._28_4_ = fVar89;
  auVar73 = ZEXT3264(local_14a0);
  fVar1 = fVar1 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar2 = fVar2 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar89 = fVar89 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  uVar46 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar47 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar41 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar50 = uVar46 ^ 0x20;
  uVar48 = uVar47 ^ 0x20;
  local_14c0._0_8_ = CONCAT44(fVar1,fVar1) ^ 0x8000000080000000;
  local_14c0._8_4_ = -fVar1;
  local_14c0._12_4_ = -fVar1;
  local_14c0._16_4_ = -fVar1;
  local_14c0._20_4_ = -fVar1;
  local_14c0._24_4_ = -fVar1;
  local_14c0._28_4_ = -fVar1;
  auVar77 = ZEXT3264(local_14c0);
  local_14e0._0_8_ = CONCAT44(fVar2,fVar2) ^ 0x8000000080000000;
  local_14e0._8_4_ = -fVar2;
  local_14e0._12_4_ = -fVar2;
  local_14e0._16_4_ = -fVar2;
  local_14e0._20_4_ = -fVar2;
  local_14e0._24_4_ = -fVar2;
  local_14e0._28_4_ = -fVar2;
  auVar83 = ZEXT3264(local_14e0);
  iVar37 = (tray->tnear).field_0.i[k];
  local_1500._4_4_ = iVar37;
  local_1500._0_4_ = iVar37;
  local_1500._8_4_ = iVar37;
  local_1500._12_4_ = iVar37;
  local_1500._16_4_ = iVar37;
  local_1500._20_4_ = iVar37;
  local_1500._24_4_ = iVar37;
  local_1500._28_4_ = iVar37;
  auVar85 = ZEXT3264(local_1500);
  local_1440 = 0x80000000;
  uStack_143c = 0x80000000;
  uStack_1438 = 0x80000000;
  uStack_1434 = 0x80000000;
  uStack_1430 = 0x80000000;
  uStack_142c = 0x80000000;
  uStack_1428 = 0x80000000;
  uStack_1424 = 0x80000000;
  local_1520._0_8_ = CONCAT44(fVar89,fVar89) ^ 0x8000000080000000;
  local_1520._8_4_ = -fVar89;
  local_1520._12_4_ = -fVar89;
  local_1520._16_4_ = -fVar89;
  local_1520._20_4_ = -fVar89;
  local_1520._24_4_ = -fVar89;
  local_1520._28_4_ = -fVar89;
  auVar95 = ZEXT3264(local_1520);
  iVar37 = (tray->tfar).field_0.i[k];
  local_1540._4_4_ = iVar37;
  local_1540._0_4_ = iVar37;
  local_1540._8_4_ = iVar37;
  local_1540._12_4_ = iVar37;
  local_1540._16_4_ = iVar37;
  local_1540._20_4_ = iVar37;
  local_1540._24_4_ = iVar37;
  local_1540._28_4_ = iVar37;
  auVar99 = ZEXT3264(local_1540);
  local_1560._16_16_ = mm_lookupmask_ps._240_16_;
  local_1560._0_16_ = mm_lookupmask_ps._0_16_;
  local_1768 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  bVar52 = true;
  auVar62._8_4_ = 0x3f800000;
  auVar62._0_8_ = 0x3f8000003f800000;
  auVar62._12_4_ = 0x3f800000;
  auVar62._16_4_ = 0x3f800000;
  auVar62._20_4_ = 0x3f800000;
  auVar62._24_4_ = 0x3f800000;
  auVar62._28_4_ = 0x3f800000;
  auVar82._8_4_ = 0xbf800000;
  auVar82._0_8_ = 0xbf800000bf800000;
  auVar82._12_4_ = 0xbf800000;
  auVar82._16_4_ = 0xbf800000;
  auVar82._20_4_ = 0xbf800000;
  auVar82._24_4_ = 0xbf800000;
  auVar82._28_4_ = 0xbf800000;
  local_1580 = vblendvps_avx(auVar62,auVar82,local_1560);
  local_1760 = uVar47;
  local_1758 = uVar46;
  do {
    uVar49 = local_1750[-1];
    local_1750 = local_1750 + -1;
    while ((uVar49 & 8) == 0) {
      uVar34 = uVar49 & 0xfffffffffffffff0;
      uVar3 = *(undefined4 *)(ray + k * 4 + 0x70);
      auVar55._4_4_ = uVar3;
      auVar55._0_4_ = uVar3;
      auVar55._8_4_ = uVar3;
      auVar55._12_4_ = uVar3;
      auVar55._16_4_ = uVar3;
      auVar55._20_4_ = uVar3;
      auVar55._24_4_ = uVar3;
      auVar55._28_4_ = uVar3;
      auVar53 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar34 + 0x100 + uVar46),auVar55,
                                *(undefined1 (*) [32])(uVar34 + 0x40 + uVar46));
      auVar53 = vfmadd213ps_fma(ZEXT1632(auVar53),auVar68._0_32_,auVar77._0_32_);
      auVar58 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar34 + 0x100 + uVar47),auVar55,
                                *(undefined1 (*) [32])(uVar34 + 0x40 + uVar47));
      auVar58 = vfmadd213ps_fma(ZEXT1632(auVar58),auVar70._0_32_,auVar83._0_32_);
      auVar82 = vpmaxsd_avx2(ZEXT1632(auVar53),ZEXT1632(auVar58));
      auVar53 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar34 + 0x100 + uVar41),auVar55,
                                *(undefined1 (*) [32])(uVar34 + 0x40 + uVar41));
      auVar53 = vfmadd213ps_fma(ZEXT1632(auVar53),auVar73._0_32_,auVar95._0_32_);
      auVar62 = vpmaxsd_avx2(ZEXT1632(auVar53),auVar85._0_32_);
      auVar53 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar34 + 0x100 + uVar50),auVar55,
                                *(undefined1 (*) [32])(uVar34 + 0x40 + uVar50));
      auVar82 = vpmaxsd_avx2(auVar82,auVar62);
      auVar58 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar34 + 0x100 + uVar48),auVar55,
                                *(undefined1 (*) [32])(uVar34 + 0x40 + uVar48));
      auVar53 = vfmadd213ps_fma(ZEXT1632(auVar53),auVar68._0_32_,auVar77._0_32_);
      auVar58 = vfmadd213ps_fma(ZEXT1632(auVar58),auVar70._0_32_,auVar83._0_32_);
      auVar62 = vpminsd_avx2(ZEXT1632(auVar53),ZEXT1632(auVar58));
      auVar53 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar34 + 0x100 + (uVar41 ^ 0x20)),auVar55,
                                *(undefined1 (*) [32])(uVar34 + 0x40 + (uVar41 ^ 0x20)));
      auVar53 = vfmadd213ps_fma(ZEXT1632(auVar53),auVar73._0_32_,auVar95._0_32_);
      auVar24 = vpminsd_avx2(ZEXT1632(auVar53),auVar99._0_32_);
      auVar62 = vpminsd_avx2(auVar62,auVar24);
      auVar82 = vcmpps_avx(auVar82,auVar62,2);
      if (((uint)uVar49 & 7) == 6) {
        auVar62 = vcmpps_avx(*(undefined1 (*) [32])(uVar34 + 0x1c0),auVar55,2);
        auVar24 = vcmpps_avx(auVar55,*(undefined1 (*) [32])(uVar34 + 0x1e0),1);
        auVar62 = vandps_avx(auVar62,auVar24);
        auVar82 = vandps_avx(auVar62,auVar82);
        auVar53 = vpackssdw_avx(auVar82._0_16_,auVar82._16_16_);
      }
      else {
        auVar53 = vpackssdw_avx(auVar82._0_16_,auVar82._16_16_);
      }
      auVar53 = vpsllw_avx(auVar53,0xf);
      if ((((((((auVar53 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar53 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar53 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar53 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar53 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar53 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar53 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar53[0xf])
      {
        bVar52 = local_1750 != &local_1200;
        goto joined_r0x005ebfb0;
      }
      auVar53 = vpacksswb_avx(auVar53,auVar53);
      bVar23 = SUB161(auVar53 >> 7,0) & 1 | (SUB161(auVar53 >> 0xf,0) & 1) << 1 |
               (SUB161(auVar53 >> 0x17,0) & 1) << 2 | (SUB161(auVar53 >> 0x1f,0) & 1) << 3 |
               (SUB161(auVar53 >> 0x27,0) & 1) << 4 | (SUB161(auVar53 >> 0x2f,0) & 1) << 5 |
               (SUB161(auVar53 >> 0x37,0) & 1) << 6 | SUB161(auVar53 >> 0x3f,0) << 7;
      lVar40 = 0;
      for (uVar49 = (ulong)bVar23; (uVar49 & 1) == 0; uVar49 = uVar49 >> 1 | 0x8000000000000000) {
        lVar40 = lVar40 + 1;
      }
      uVar49 = *(ulong *)(uVar34 + lVar40 * 8);
      uVar36 = bVar23 - 1 & (uint)bVar23;
      uVar38 = (ulong)uVar36;
      if (uVar36 != 0) {
        *local_1750 = uVar49;
        lVar40 = 0;
        for (; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x8000000000000000) {
          lVar40 = lVar40 + 1;
        }
        uVar36 = uVar36 - 1 & uVar36;
        uVar38 = (ulong)uVar36;
        bVar51 = uVar36 == 0;
        while( true ) {
          local_1750 = local_1750 + 1;
          uVar49 = *(ulong *)(uVar34 + lVar40 * 8);
          if (bVar51) break;
          *local_1750 = uVar49;
          lVar40 = 0;
          for (uVar49 = uVar38; (uVar49 & 1) == 0; uVar49 = uVar49 >> 1 | 0x8000000000000000) {
            lVar40 = lVar40 + 1;
          }
          uVar38 = uVar38 - 1 & uVar38;
          bVar51 = uVar38 == 0;
        }
      }
    }
    local_1748 = (ulong)((uint)uVar49 & 0xf) - 8;
    if (local_1748 != 0) {
      uVar49 = uVar49 & 0xfffffffffffffff0;
      local_1740 = 0;
      do {
        lVar35 = local_1740 * 0x60;
        pSVar11 = context->scene;
        pRVar12 = (pSVar11->geometries).items;
        pGVar13 = pRVar12[*(uint *)(uVar49 + 0x40 + lVar35)].ptr;
        fVar1 = (pGVar13->time_range).lower;
        fVar1 = pGVar13->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0x70) - fVar1) / ((pGVar13->time_range).upper - fVar1));
        auVar53 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),9);
        auVar53 = vminss_avx(auVar53,ZEXT416((uint)(pGVar13->fnumTimeSegments + -1.0)));
        auVar57 = vmaxss_avx(ZEXT816(0) << 0x20,auVar53);
        iVar37 = (int)auVar57._0_4_;
        lVar44 = (long)iVar37 * 0x38;
        lVar40 = *(long *)(*(long *)&pGVar13[2].numPrimitives + lVar44);
        local_1710 = (ulong)*(uint *)(uVar49 + 4 + lVar35);
        auVar53 = *(undefined1 (*) [16])(lVar40 + (ulong)*(uint *)(uVar49 + lVar35) * 4);
        uVar47 = (ulong)*(uint *)(uVar49 + 0x10 + lVar35);
        auVar58 = *(undefined1 (*) [16])(lVar40 + uVar47 * 4);
        uVar34 = (ulong)*(uint *)(uVar49 + 0x20 + lVar35);
        auVar61 = *(undefined1 (*) [16])(lVar40 + uVar34 * 4);
        uVar38 = (ulong)*(uint *)(uVar49 + 0x30 + lVar35);
        auVar4 = *(undefined1 (*) [16])(lVar40 + uVar38 * 4);
        local_1728 = *(long *)&pRVar12[*(uint *)(uVar49 + 0x44 + lVar35)].ptr[2].numPrimitives;
        lVar40 = *(long *)(local_1728 + lVar44);
        auVar5 = *(undefined1 (*) [16])(lVar40 + local_1710 * 4);
        local_1700 = (ulong)*(uint *)(uVar49 + 0x14 + lVar35);
        auVar54 = *(undefined1 (*) [16])(lVar40 + local_1700 * 4);
        local_16f8 = (ulong)*(uint *)(uVar49 + 0x24 + lVar35);
        auVar6 = *(undefined1 (*) [16])(lVar40 + local_16f8 * 4);
        uVar42 = (ulong)*(uint *)(uVar49 + 0x34 + lVar35);
        auVar7 = *(undefined1 (*) [16])(lVar40 + uVar42 * 4);
        lVar40 = *(long *)&pRVar12[*(uint *)(uVar49 + 0x48 + lVar35)].ptr[2].numPrimitives;
        lVar14 = *(long *)(lVar40 + lVar44);
        uVar43 = (ulong)*(uint *)(uVar49 + 8 + lVar35);
        auVar8 = *(undefined1 (*) [16])(lVar14 + uVar43 * 4);
        local_1720 = (ulong)*(uint *)(uVar49 + 0x18 + lVar35);
        auVar9 = *(undefined1 (*) [16])(lVar14 + local_1720 * 4);
        local_1718 = (ulong)*(uint *)(uVar49 + 0x28 + lVar35);
        auVar60 = *(undefined1 (*) [16])(lVar14 + local_1718 * 4);
        local_1708 = (ulong)*(uint *)(uVar49 + 0x38 + lVar35);
        auVar10 = *(undefined1 (*) [16])(lVar14 + local_1708 * 4);
        fVar1 = fVar1 - auVar57._0_4_;
        lVar14 = *(long *)&pRVar12[*(uint *)(uVar49 + 0x4c + lVar35)].ptr[2].numPrimitives;
        lVar44 = *(long *)(lVar14 + lVar44);
        uVar46 = (ulong)*(uint *)(uVar49 + 0xc + lVar35);
        auVar57 = *(undefined1 (*) [16])(lVar44 + uVar46 * 4);
        local_1738 = (ulong)*(uint *)(uVar49 + 0x1c + lVar35);
        auVar64 = *(undefined1 (*) [16])(lVar44 + local_1738 * 4);
        auVar69 = vunpcklps_avx(auVar53,auVar8);
        auVar8 = vunpckhps_avx(auVar53,auVar8);
        auVar96 = vunpcklps_avx(auVar5,auVar57);
        auVar5 = vunpckhps_avx(auVar5,auVar57);
        uVar45 = (ulong)*(uint *)(uVar49 + 0x2c + lVar35);
        auVar53 = *(undefined1 (*) [16])(lVar44 + uVar45 * 4);
        local_1630 = vunpcklps_avx(auVar8,auVar5);
        auVar8 = vunpcklps_avx(auVar69,auVar96);
        local_1650 = vunpckhps_avx(auVar69,auVar96);
        auVar57 = vunpcklps_avx(auVar58,auVar9);
        auVar5 = vunpckhps_avx(auVar58,auVar9);
        auVar9 = vunpcklps_avx(auVar54,auVar64);
        auVar54 = vunpckhps_avx(auVar54,auVar64);
        local_1730 = (ulong)*(uint *)(uVar49 + 0x3c + lVar35);
        auVar58 = *(undefined1 (*) [16])(lVar44 + local_1730 * 4);
        local_1620 = vunpcklps_avx(auVar5,auVar54);
        local_1660 = vunpcklps_avx(auVar57,auVar9);
        local_1640 = vunpckhps_avx(auVar57,auVar9);
        auVar54 = vunpcklps_avx(auVar61,auVar60);
        auVar61 = vunpckhps_avx(auVar61,auVar60);
        auVar9 = vunpcklps_avx(auVar6,auVar53);
        auVar5 = vunpckhps_avx(auVar6,auVar53);
        lVar39 = (long)(iVar37 + 1) * 0x38;
        lVar44 = *(long *)(*(long *)&pGVar13[2].numPrimitives + lVar39);
        auVar53 = *(undefined1 (*) [16])(lVar44 + (ulong)*(uint *)(uVar49 + lVar35) * 4);
        auVar6 = vunpcklps_avx(auVar61,auVar5);
        local_1690 = vunpcklps_avx(auVar54,auVar9);
        local_1670 = vunpckhps_avx(auVar54,auVar9);
        auVar5 = vunpcklps_avx(auVar4,auVar10);
        auVar61 = vunpckhps_avx(auVar4,auVar10);
        auVar54 = vunpcklps_avx(auVar7,auVar58);
        auVar4 = vunpckhps_avx(auVar7,auVar58);
        lVar40 = *(long *)(lVar40 + lVar39);
        auVar58 = *(undefined1 (*) [16])(lVar40 + uVar43 * 4);
        auVar7 = vunpcklps_avx(auVar61,auVar4);
        local_16a0 = vunpcklps_avx(auVar5,auVar54);
        local_1680 = vunpckhps_avx(auVar5,auVar54);
        lVar15 = *(long *)(local_1728 + lVar39);
        auVar4 = vunpcklps_avx(auVar53,auVar58);
        auVar61 = vunpckhps_avx(auVar53,auVar58);
        auVar53 = *(undefined1 (*) [16])(lVar15 + local_1710 * 4);
        lVar14 = *(long *)(lVar14 + lVar39);
        auVar58 = *(undefined1 (*) [16])(lVar14 + uVar46 * 4);
        auVar5 = vunpcklps_avx(auVar53,auVar58);
        auVar53 = vunpckhps_avx(auVar53,auVar58);
        auVar9 = vunpcklps_avx(auVar61,auVar53);
        auVar60 = vunpcklps_avx(auVar4,auVar5);
        auVar61 = vunpckhps_avx(auVar4,auVar5);
        auVar53 = *(undefined1 (*) [16])(lVar44 + uVar47 * 4);
        auVar58 = *(undefined1 (*) [16])(lVar40 + local_1720 * 4);
        auVar5 = vunpcklps_avx(auVar53,auVar58);
        auVar4 = vunpckhps_avx(auVar53,auVar58);
        auVar53 = *(undefined1 (*) [16])(lVar15 + local_1700 * 4);
        auVar58 = *(undefined1 (*) [16])(lVar14 + local_1738 * 4);
        auVar54 = vunpcklps_avx(auVar53,auVar58);
        auVar53 = vunpckhps_avx(auVar53,auVar58);
        auVar10 = vunpcklps_avx(auVar4,auVar53);
        auVar57 = vunpcklps_avx(auVar5,auVar54);
        auVar4 = vunpckhps_avx(auVar5,auVar54);
        auVar53 = *(undefined1 (*) [16])(lVar44 + uVar34 * 4);
        auVar58 = *(undefined1 (*) [16])(lVar40 + local_1718 * 4);
        auVar54 = vunpcklps_avx(auVar53,auVar58);
        auVar5 = vunpckhps_avx(auVar53,auVar58);
        auVar53 = *(undefined1 (*) [16])(lVar15 + local_16f8 * 4);
        auVar58 = *(undefined1 (*) [16])(lVar14 + uVar45 * 4);
        auVar64 = vunpcklps_avx(auVar53,auVar58);
        auVar53 = vunpckhps_avx(auVar53,auVar58);
        auVar69 = vunpcklps_avx(auVar5,auVar53);
        auVar96 = vunpcklps_avx(auVar54,auVar64);
        auVar5 = vunpckhps_avx(auVar54,auVar64);
        auVar53 = *(undefined1 (*) [16])(lVar44 + uVar38 * 4);
        auVar58 = *(undefined1 (*) [16])(lVar40 + local_1708 * 4);
        auVar64 = vunpcklps_avx(auVar53,auVar58);
        auVar54 = vunpckhps_avx(auVar53,auVar58);
        auVar53 = *(undefined1 (*) [16])(lVar15 + uVar42 * 4);
        auVar58 = *(undefined1 (*) [16])(lVar14 + local_1730 * 4);
        auVar66 = vunpcklps_avx(auVar53,auVar58);
        auVar53 = vunpckhps_avx(auVar53,auVar58);
        auVar58 = vunpcklps_avx(auVar54,auVar53);
        auVar54 = vunpcklps_avx(auVar64,auVar66);
        auVar53 = vunpckhps_avx(auVar64,auVar66);
        fVar2 = 1.0 - fVar1;
        auVar103._4_4_ = fVar2;
        auVar103._0_4_ = fVar2;
        auVar103._8_4_ = fVar2;
        auVar103._12_4_ = fVar2;
        auVar64._0_4_ = fVar1 * auVar60._0_4_;
        auVar64._4_4_ = fVar1 * auVar60._4_4_;
        auVar64._8_4_ = fVar1 * auVar60._8_4_;
        auVar64._12_4_ = fVar1 * auVar60._12_4_;
        auVar8 = vfmadd231ps_fma(auVar64,auVar103,auVar8);
        auVar71._0_4_ = fVar1 * auVar61._0_4_;
        auVar71._4_4_ = fVar1 * auVar61._4_4_;
        auVar71._8_4_ = fVar1 * auVar61._8_4_;
        auVar71._12_4_ = fVar1 * auVar61._12_4_;
        auVar61 = vfmadd231ps_fma(auVar71,auVar103,local_1650);
        auVar66._0_4_ = auVar9._0_4_ * fVar1;
        auVar66._4_4_ = auVar9._4_4_ * fVar1;
        auVar66._8_4_ = auVar9._8_4_ * fVar1;
        auVar66._12_4_ = auVar9._12_4_ * fVar1;
        auVar9 = vfmadd231ps_fma(auVar66,auVar103,local_1630);
        auVar60._0_4_ = fVar1 * auVar57._0_4_;
        auVar60._4_4_ = fVar1 * auVar57._4_4_;
        auVar60._8_4_ = fVar1 * auVar57._8_4_;
        auVar60._12_4_ = fVar1 * auVar57._12_4_;
        auVar60 = vfmadd231ps_fma(auVar60,auVar103,local_1660);
        auVar57._0_4_ = fVar1 * auVar4._0_4_;
        auVar57._4_4_ = fVar1 * auVar4._4_4_;
        auVar57._8_4_ = fVar1 * auVar4._8_4_;
        auVar57._12_4_ = fVar1 * auVar4._12_4_;
        auVar4 = vfmadd231ps_fma(auVar57,auVar103,local_1640);
        auVar75._0_4_ = auVar10._0_4_ * fVar1;
        auVar75._4_4_ = auVar10._4_4_ * fVar1;
        auVar75._8_4_ = auVar10._8_4_ * fVar1;
        auVar75._12_4_ = auVar10._12_4_ * fVar1;
        auVar10 = vfmadd231ps_fma(auVar75,auVar103,local_1620);
        auVar84._0_4_ = auVar96._0_4_ * fVar1;
        auVar84._4_4_ = auVar96._4_4_ * fVar1;
        auVar84._8_4_ = auVar96._8_4_ * fVar1;
        auVar84._12_4_ = auVar96._12_4_ * fVar1;
        auVar57 = vfmadd231ps_fma(auVar84,auVar103,local_1690);
        auVar96._0_4_ = auVar5._0_4_ * fVar1;
        auVar96._4_4_ = auVar5._4_4_ * fVar1;
        auVar96._8_4_ = auVar5._8_4_ * fVar1;
        auVar96._12_4_ = auVar5._12_4_ * fVar1;
        auVar5 = vfmadd231ps_fma(auVar96,auVar103,local_1670);
        auVar100._0_4_ = auVar69._0_4_ * fVar1;
        auVar100._4_4_ = auVar69._4_4_ * fVar1;
        auVar100._8_4_ = auVar69._8_4_ * fVar1;
        auVar100._12_4_ = auVar69._12_4_ * fVar1;
        auVar6 = vfmadd231ps_fma(auVar100,auVar103,auVar6);
        auVar69._0_4_ = fVar1 * auVar54._0_4_;
        auVar69._4_4_ = fVar1 * auVar54._4_4_;
        auVar69._8_4_ = fVar1 * auVar54._8_4_;
        auVar69._12_4_ = fVar1 * auVar54._12_4_;
        auVar106._0_4_ = auVar53._0_4_ * fVar1;
        auVar106._4_4_ = auVar53._4_4_ * fVar1;
        auVar106._8_4_ = auVar53._8_4_ * fVar1;
        auVar106._12_4_ = auVar53._12_4_ * fVar1;
        auVar54._0_4_ = auVar58._0_4_ * fVar1;
        auVar54._4_4_ = auVar58._4_4_ * fVar1;
        auVar54._8_4_ = auVar58._8_4_ * fVar1;
        auVar54._12_4_ = auVar58._12_4_ * fVar1;
        lVar40 = uVar49 + 0x40 + lVar35;
        local_1400 = *(undefined8 *)(lVar40 + 0x10);
        uStack_13f8 = *(undefined8 *)(lVar40 + 0x18);
        auVar53 = vfmadd231ps_fma(auVar69,auVar103,local_16a0);
        uStack_13f0 = local_1400;
        uStack_13e8 = uStack_13f8;
        lVar35 = uVar49 + 0x50 + lVar35;
        local_1420 = *(undefined8 *)(lVar35 + 0x10);
        uStack_1418 = *(undefined8 *)(lVar35 + 0x18);
        auVar58 = vfmadd231ps_fma(auVar106,auVar103,local_1680);
        auVar54 = vfmadd231ps_fma(auVar54,auVar103,auVar7);
        uStack_1410 = local_1420;
        uStack_1408 = uStack_1418;
        auVar65._16_16_ = auVar57;
        auVar65._0_16_ = auVar8;
        auVar72._16_16_ = auVar5;
        auVar72._0_16_ = auVar61;
        auVar81._16_16_ = auVar6;
        auVar81._0_16_ = auVar9;
        auVar63._16_16_ = auVar60;
        auVar63._0_16_ = auVar60;
        auVar59._16_16_ = auVar4;
        auVar59._0_16_ = auVar4;
        auVar67._16_16_ = auVar10;
        auVar67._0_16_ = auVar10;
        auVar92._16_16_ = auVar53;
        auVar92._0_16_ = auVar53;
        auVar97._16_16_ = auVar58;
        auVar97._0_16_ = auVar58;
        auVar56._16_16_ = auVar54;
        auVar56._0_16_ = auVar54;
        auVar62 = vsubps_avx(auVar65,auVar63);
        auVar82 = vsubps_avx(auVar72,auVar59);
        auVar24 = vsubps_avx(auVar81,auVar67);
        auVar55 = vsubps_avx(auVar92,auVar65);
        auVar19 = vsubps_avx(auVar97,auVar72);
        auVar20 = vsubps_avx(auVar56,auVar81);
        auVar21._4_4_ = auVar20._4_4_ * auVar82._4_4_;
        auVar21._0_4_ = auVar20._0_4_ * auVar82._0_4_;
        auVar21._8_4_ = auVar20._8_4_ * auVar82._8_4_;
        auVar21._12_4_ = auVar20._12_4_ * auVar82._12_4_;
        auVar21._16_4_ = auVar20._16_4_ * auVar82._16_4_;
        auVar21._20_4_ = auVar20._20_4_ * auVar82._20_4_;
        auVar21._24_4_ = auVar20._24_4_ * auVar82._24_4_;
        auVar21._28_4_ = auVar54._12_4_;
        auVar5 = vfmsub231ps_fma(auVar21,auVar19,auVar24);
        uVar3 = *(undefined4 *)(ray + k * 4);
        auVar101._4_4_ = uVar3;
        auVar101._0_4_ = uVar3;
        auVar101._8_4_ = uVar3;
        auVar101._12_4_ = uVar3;
        auVar101._16_4_ = uVar3;
        auVar101._20_4_ = uVar3;
        auVar101._24_4_ = uVar3;
        auVar101._28_4_ = uVar3;
        uVar3 = *(undefined4 *)(ray + k * 4 + 0x10);
        auVar104._4_4_ = uVar3;
        auVar104._0_4_ = uVar3;
        auVar104._8_4_ = uVar3;
        auVar104._12_4_ = uVar3;
        auVar104._16_4_ = uVar3;
        auVar104._20_4_ = uVar3;
        auVar104._24_4_ = uVar3;
        auVar104._28_4_ = uVar3;
        uVar3 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar107._4_4_ = uVar3;
        auVar107._0_4_ = uVar3;
        auVar107._8_4_ = uVar3;
        auVar107._12_4_ = uVar3;
        auVar107._16_4_ = uVar3;
        auVar107._20_4_ = uVar3;
        auVar107._24_4_ = uVar3;
        auVar107._28_4_ = uVar3;
        fVar1 = *(float *)(ray + k * 4 + 0x40);
        auVar93._4_4_ = fVar1;
        auVar93._0_4_ = fVar1;
        auVar93._8_4_ = fVar1;
        auVar93._12_4_ = fVar1;
        auVar93._16_4_ = fVar1;
        auVar93._20_4_ = fVar1;
        auVar93._24_4_ = fVar1;
        auVar93._28_4_ = fVar1;
        auVar22._4_4_ = auVar24._4_4_ * auVar55._4_4_;
        auVar22._0_4_ = auVar24._0_4_ * auVar55._0_4_;
        auVar22._8_4_ = auVar24._8_4_ * auVar55._8_4_;
        auVar22._12_4_ = auVar24._12_4_ * auVar55._12_4_;
        auVar22._16_4_ = auVar24._16_4_ * auVar55._16_4_;
        auVar22._20_4_ = auVar24._20_4_ * auVar55._20_4_;
        auVar22._24_4_ = auVar24._24_4_ * auVar55._24_4_;
        auVar22._28_4_ = auVar4._12_4_;
        auVar21 = vsubps_avx(auVar65,auVar101);
        fVar2 = *(float *)(ray + k * 4 + 0x50);
        auVar102._4_4_ = fVar2;
        auVar102._0_4_ = fVar2;
        auVar102._8_4_ = fVar2;
        auVar102._12_4_ = fVar2;
        auVar102._16_4_ = fVar2;
        auVar102._20_4_ = fVar2;
        auVar102._24_4_ = fVar2;
        auVar102._28_4_ = fVar2;
        auVar4 = vfmsub231ps_fma(auVar22,auVar20,auVar62);
        auVar22 = vsubps_avx(auVar72,auVar104);
        fVar89 = *(float *)(ray + k * 4 + 0x60);
        auVar105._4_4_ = fVar89;
        auVar105._0_4_ = fVar89;
        auVar105._8_4_ = fVar89;
        auVar105._12_4_ = fVar89;
        auVar105._16_4_ = fVar89;
        auVar105._20_4_ = fVar89;
        auVar105._24_4_ = fVar89;
        auVar105._28_4_ = fVar89;
        auVar56 = vsubps_avx(auVar81,auVar107);
        auVar25._4_4_ = fVar1 * auVar22._4_4_;
        auVar25._0_4_ = fVar1 * auVar22._0_4_;
        auVar25._8_4_ = fVar1 * auVar22._8_4_;
        auVar25._12_4_ = fVar1 * auVar22._12_4_;
        auVar25._16_4_ = fVar1 * auVar22._16_4_;
        auVar25._20_4_ = fVar1 * auVar22._20_4_;
        auVar25._24_4_ = fVar1 * auVar22._24_4_;
        auVar25._28_4_ = uVar3;
        auVar53 = vfmsub231ps_fma(auVar25,auVar21,auVar102);
        auVar26._4_4_ = auVar20._4_4_ * auVar53._4_4_;
        auVar26._0_4_ = auVar20._0_4_ * auVar53._0_4_;
        auVar26._8_4_ = auVar20._8_4_ * auVar53._8_4_;
        auVar26._12_4_ = auVar20._12_4_ * auVar53._12_4_;
        auVar26._16_4_ = auVar20._16_4_ * 0.0;
        auVar26._20_4_ = auVar20._20_4_ * 0.0;
        auVar26._24_4_ = auVar20._24_4_ * 0.0;
        auVar26._28_4_ = auVar20._28_4_;
        auVar108._0_4_ = auVar24._0_4_ * auVar53._0_4_;
        auVar108._4_4_ = auVar24._4_4_ * auVar53._4_4_;
        auVar108._8_4_ = auVar24._8_4_ * auVar53._8_4_;
        auVar108._12_4_ = auVar24._12_4_ * auVar53._12_4_;
        auVar108._16_4_ = auVar24._16_4_ * 0.0;
        auVar108._20_4_ = auVar24._20_4_ * 0.0;
        auVar108._24_4_ = auVar24._24_4_ * 0.0;
        auVar108._28_4_ = 0;
        auVar20._4_4_ = fVar89 * auVar21._4_4_;
        auVar20._0_4_ = fVar89 * auVar21._0_4_;
        auVar20._8_4_ = fVar89 * auVar21._8_4_;
        auVar20._12_4_ = fVar89 * auVar21._12_4_;
        auVar20._16_4_ = fVar89 * auVar21._16_4_;
        auVar20._20_4_ = fVar89 * auVar21._20_4_;
        auVar20._24_4_ = fVar89 * auVar21._24_4_;
        auVar20._28_4_ = auVar24._28_4_;
        auVar58 = vfmsub231ps_fma(auVar20,auVar56,auVar93);
        auVar53 = vfmadd231ps_fma(auVar26,ZEXT1632(auVar58),auVar19);
        auVar58 = vfmadd231ps_fma(auVar108,auVar82,ZEXT1632(auVar58));
        auVar24._4_4_ = auVar62._4_4_ * auVar19._4_4_;
        auVar24._0_4_ = auVar62._0_4_ * auVar19._0_4_;
        auVar24._8_4_ = auVar62._8_4_ * auVar19._8_4_;
        auVar24._12_4_ = auVar62._12_4_ * auVar19._12_4_;
        auVar24._16_4_ = auVar62._16_4_ * auVar19._16_4_;
        auVar24._20_4_ = auVar62._20_4_ * auVar19._20_4_;
        auVar24._24_4_ = auVar62._24_4_ * auVar19._24_4_;
        auVar24._28_4_ = auVar19._28_4_;
        auVar54 = vfmsub231ps_fma(auVar24,auVar55,auVar82);
        auVar19._4_4_ = fVar2 * auVar56._4_4_;
        auVar19._0_4_ = fVar2 * auVar56._0_4_;
        auVar19._8_4_ = fVar2 * auVar56._8_4_;
        auVar19._12_4_ = fVar2 * auVar56._12_4_;
        auVar19._16_4_ = fVar2 * auVar56._16_4_;
        auVar19._20_4_ = fVar2 * auVar56._20_4_;
        auVar19._24_4_ = fVar2 * auVar56._24_4_;
        auVar19._28_4_ = auVar82._28_4_;
        auVar6 = vfmsub231ps_fma(auVar19,auVar22,auVar105);
        fVar1 = auVar54._0_4_;
        fVar2 = auVar54._4_4_;
        auVar27._4_4_ = fVar89 * fVar2;
        auVar27._0_4_ = fVar89 * fVar1;
        fVar17 = auVar54._8_4_;
        auVar27._8_4_ = fVar89 * fVar17;
        fVar18 = auVar54._12_4_;
        auVar27._12_4_ = fVar89 * fVar18;
        auVar27._16_4_ = fVar89 * 0.0;
        auVar27._20_4_ = fVar89 * 0.0;
        auVar27._24_4_ = fVar89 * 0.0;
        auVar27._28_4_ = fVar89;
        auVar61 = vfmadd231ps_fma(auVar27,ZEXT1632(auVar4),auVar102);
        auVar61 = vfmadd231ps_fma(ZEXT1632(auVar61),ZEXT1632(auVar5),auVar93);
        auVar53 = vfmadd231ps_fma(ZEXT1632(auVar53),ZEXT1632(auVar6),auVar55);
        auVar33._4_4_ = uStack_143c;
        auVar33._0_4_ = local_1440;
        auVar33._8_4_ = uStack_1438;
        auVar33._12_4_ = uStack_1434;
        auVar33._16_4_ = uStack_1430;
        auVar33._20_4_ = uStack_142c;
        auVar33._24_4_ = uStack_1428;
        auVar33._28_4_ = uStack_1424;
        auVar82 = vandps_avx(ZEXT1632(auVar61),auVar33);
        uVar36 = auVar82._0_4_;
        local_13e0._0_4_ = (float)(uVar36 ^ auVar53._0_4_);
        uVar86 = auVar82._4_4_;
        local_13e0._4_4_ = (float)(uVar86 ^ auVar53._4_4_);
        uVar87 = auVar82._8_4_;
        local_13e0._8_4_ = (float)(uVar87 ^ auVar53._8_4_);
        uVar88 = auVar82._12_4_;
        local_13e0._12_4_ = (float)(uVar88 ^ auVar53._12_4_);
        fVar89 = auVar82._16_4_;
        local_13e0._16_4_ = fVar89;
        fVar90 = auVar82._20_4_;
        local_13e0._20_4_ = fVar90;
        fVar91 = auVar82._24_4_;
        local_13e0._24_4_ = fVar91;
        fStack_1284 = auVar82._28_4_;
        local_13e0._28_4_ = fStack_1284;
        auVar53 = vfmadd231ps_fma(ZEXT1632(auVar58),auVar62,ZEXT1632(auVar6));
        local_13c0._0_4_ = (float)(uVar36 ^ auVar53._0_4_);
        local_13c0._4_4_ = (float)(uVar86 ^ auVar53._4_4_);
        local_13c0._8_4_ = (float)(uVar87 ^ auVar53._8_4_);
        local_13c0._12_4_ = (float)(uVar88 ^ auVar53._12_4_);
        local_13c0._16_4_ = fVar89;
        local_13c0._20_4_ = fVar90;
        local_13c0._24_4_ = fVar91;
        local_13c0._28_4_ = fStack_1284;
        auVar82 = vcmpps_avx(local_13e0,ZEXT832(0) << 0x20,5);
        auVar62 = vcmpps_avx(local_13c0,ZEXT832(0) << 0x20,5);
        auVar82 = vandps_avx(auVar62,auVar82);
        auVar76._8_4_ = 0x7fffffff;
        auVar76._0_8_ = 0x7fffffff7fffffff;
        auVar76._12_4_ = 0x7fffffff;
        auVar76._16_4_ = 0x7fffffff;
        auVar76._20_4_ = 0x7fffffff;
        auVar76._24_4_ = 0x7fffffff;
        auVar76._28_4_ = 0x7fffffff;
        local_1380 = vandps_avx(ZEXT1632(auVar61),auVar76);
        auVar62 = vcmpps_avx(ZEXT1632(auVar61),ZEXT832(0) << 0x20,4);
        auVar82 = vandps_avx(auVar82,auVar62);
        auVar98._0_4_ = local_13e0._0_4_ + local_13c0._0_4_;
        auVar98._4_4_ = local_13e0._4_4_ + local_13c0._4_4_;
        auVar98._8_4_ = local_13e0._8_4_ + local_13c0._8_4_;
        auVar98._12_4_ = local_13e0._12_4_ + local_13c0._12_4_;
        auVar98._16_4_ = fVar89 + fVar89;
        auVar98._20_4_ = fVar90 + fVar90;
        auVar98._24_4_ = fVar91 + fVar91;
        auVar98._28_4_ = fStack_1284 + fStack_1284;
        auVar62 = vcmpps_avx(auVar98,local_1380,2);
        auVar24 = auVar62 & auVar82;
        if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar24 >> 0x7f,0) != '\0') ||
              (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar24 >> 0xbf,0) != '\0') ||
            (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar24[0x1f] < '\0') {
          auVar82 = vandps_avx(auVar82,auVar62);
          auVar53 = vpackssdw_avx(auVar82._0_16_,auVar82._16_16_);
          auVar28._4_4_ = auVar56._4_4_ * fVar2;
          auVar28._0_4_ = auVar56._0_4_ * fVar1;
          auVar28._8_4_ = auVar56._8_4_ * fVar17;
          auVar28._12_4_ = auVar56._12_4_ * fVar18;
          auVar28._16_4_ = auVar56._16_4_ * 0.0;
          auVar28._20_4_ = auVar56._20_4_ * 0.0;
          auVar28._24_4_ = auVar56._24_4_ * 0.0;
          auVar28._28_4_ = auVar56._28_4_;
          auVar58 = vfmadd213ps_fma(auVar22,ZEXT1632(auVar4),auVar28);
          auVar58 = vfmadd213ps_fma(auVar21,ZEXT1632(auVar5),ZEXT1632(auVar58));
          local_13a0._0_4_ = (float)(uVar36 ^ auVar58._0_4_);
          local_13a0._4_4_ = (float)(uVar86 ^ auVar58._4_4_);
          local_13a0._8_4_ = (float)(uVar87 ^ auVar58._8_4_);
          local_13a0._12_4_ = (float)(uVar88 ^ auVar58._12_4_);
          local_13a0._16_4_ = fVar89;
          local_13a0._20_4_ = fVar90;
          local_13a0._24_4_ = fVar91;
          local_13a0._28_4_ = fStack_1284;
          fVar74 = *(float *)(ray + k * 4 + 0x30);
          auVar29._4_4_ = local_1380._4_4_ * fVar74;
          auVar29._0_4_ = local_1380._0_4_ * fVar74;
          auVar29._8_4_ = local_1380._8_4_ * fVar74;
          auVar29._12_4_ = local_1380._12_4_ * fVar74;
          auVar29._16_4_ = local_1380._16_4_ * fVar74;
          auVar29._20_4_ = local_1380._20_4_ * fVar74;
          auVar29._24_4_ = local_1380._24_4_ * fVar74;
          auVar29._28_4_ = fVar74;
          auVar82 = vcmpps_avx(auVar29,local_13a0,1);
          fVar74 = *(float *)(ray + k * 4 + 0x80);
          auVar68 = ZEXT3264(CONCAT428(fVar74,CONCAT424(fVar74,CONCAT420(fVar74,CONCAT416(fVar74,
                                                  CONCAT412(fVar74,CONCAT48(fVar74,CONCAT44(fVar74,
                                                  fVar74))))))));
          auVar30._4_4_ = fVar74 * local_1380._4_4_;
          auVar30._0_4_ = fVar74 * local_1380._0_4_;
          auVar30._8_4_ = fVar74 * local_1380._8_4_;
          auVar30._12_4_ = fVar74 * local_1380._12_4_;
          auVar30._16_4_ = fVar74 * local_1380._16_4_;
          auVar30._20_4_ = fVar74 * local_1380._20_4_;
          auVar30._24_4_ = fVar74 * local_1380._24_4_;
          auVar30._28_4_ = auVar56._28_4_;
          auVar62 = vcmpps_avx(local_13a0,auVar30,2);
          auVar82 = vandps_avx(auVar62,auVar82);
          auVar58 = vpackssdw_avx(auVar82._0_16_,auVar82._16_16_);
          auVar53 = vpand_avx(auVar53,auVar58);
          auVar82 = vpmovzxwd_avx2(auVar53);
          auVar82 = vpslld_avx2(auVar82,0x1f);
          if ((((((((auVar82 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar82 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar82 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar82 >> 0x7f,0) != '\0') ||
                (auVar82 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar82 >> 0xbf,0) != '\0') ||
              (auVar82 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar82[0x1f] < '\0') {
            local_1300 = vpsrad_avx2(auVar82,0x1f);
            local_1360 = ZEXT1632(auVar5);
            local_1340 = ZEXT1632(auVar4);
            local_1320 = ZEXT1632(auVar54);
            auVar82 = vrcpps_avx(local_1380);
            local_1220 = local_1560;
            auVar94._8_4_ = 0x3f800000;
            auVar94._0_8_ = 0x3f8000003f800000;
            auVar94._12_4_ = 0x3f800000;
            auVar94._16_4_ = 0x3f800000;
            auVar94._20_4_ = 0x3f800000;
            auVar94._24_4_ = 0x3f800000;
            auVar94._28_4_ = 0x3f800000;
            auVar58 = vfnmadd213ps_fma(local_1380,auVar82,auVar94);
            auVar58 = vfmadd132ps_fma(ZEXT1632(auVar58),auVar82,auVar82);
            fVar74 = auVar58._0_4_;
            fVar78 = auVar58._4_4_;
            fVar79 = auVar58._8_4_;
            fVar80 = auVar58._12_4_;
            local_12a0[0] = fVar74 * local_13a0._0_4_;
            local_12a0[1] = fVar78 * local_13a0._4_4_;
            local_12a0[2] = fVar79 * local_13a0._8_4_;
            local_12a0[3] = fVar80 * local_13a0._12_4_;
            fStack_1290 = fVar89 * 0.0;
            fStack_128c = fVar90 * 0.0;
            fStack_1288 = fVar91 * 0.0;
            auVar31._4_4_ = fVar78 * local_13e0._4_4_;
            auVar31._0_4_ = fVar74 * local_13e0._0_4_;
            auVar31._8_4_ = fVar79 * local_13e0._8_4_;
            auVar31._12_4_ = fVar80 * local_13e0._12_4_;
            auVar31._16_4_ = fVar89 * 0.0;
            auVar31._20_4_ = fVar90 * 0.0;
            auVar31._24_4_ = fVar91 * 0.0;
            auVar31._28_4_ = fStack_1284;
            auVar82 = vminps_avx(auVar31,auVar94);
            auVar32._4_4_ = fVar78 * local_13c0._4_4_;
            auVar32._0_4_ = fVar74 * local_13c0._0_4_;
            auVar32._8_4_ = fVar79 * local_13c0._8_4_;
            auVar32._12_4_ = fVar80 * local_13c0._12_4_;
            auVar32._16_4_ = fVar89 * 0.0;
            auVar32._20_4_ = fVar90 * 0.0;
            auVar32._24_4_ = fVar91 * 0.0;
            auVar32._28_4_ = fStack_1284;
            auVar62 = vminps_avx(auVar32,auVar94);
            auVar24 = vsubps_avx(auVar94,auVar82);
            auVar55 = vsubps_avx(auVar94,auVar62);
            local_12c0 = vblendvps_avx(auVar62,auVar24,local_1560);
            local_12e0 = vblendvps_avx(auVar82,auVar55,local_1560);
            fVar89 = local_1580._0_4_;
            local_1280._0_4_ = auVar5._0_4_ * fVar89;
            fVar90 = local_1580._4_4_;
            local_1280._4_4_ = auVar5._4_4_ * fVar90;
            fVar91 = local_1580._8_4_;
            local_1280._8_4_ = auVar5._8_4_ * fVar91;
            fVar74 = local_1580._12_4_;
            local_1280._12_4_ = auVar5._12_4_ * fVar74;
            fVar78 = local_1580._16_4_;
            local_1280._16_4_ = fVar78 * 0.0;
            fVar79 = local_1580._20_4_;
            local_1280._20_4_ = fVar79 * 0.0;
            fVar80 = local_1580._24_4_;
            local_1280._24_4_ = fVar80 * 0.0;
            local_1280._28_4_ = 0;
            local_1260._0_4_ = fVar89 * auVar4._0_4_;
            local_1260._4_4_ = fVar90 * auVar4._4_4_;
            local_1260._8_4_ = fVar91 * auVar4._8_4_;
            local_1260._12_4_ = fVar74 * auVar4._12_4_;
            local_1260._16_4_ = fVar78 * 0.0;
            local_1260._20_4_ = fVar79 * 0.0;
            local_1260._24_4_ = fVar80 * 0.0;
            local_1260._28_4_ = 0;
            local_1240._0_4_ = fVar89 * fVar1;
            local_1240._4_4_ = fVar90 * fVar2;
            local_1240._8_4_ = fVar91 * fVar17;
            local_1240._12_4_ = fVar74 * fVar18;
            local_1240._16_4_ = fVar78 * 0.0;
            local_1240._20_4_ = fVar79 * 0.0;
            local_1240._24_4_ = fVar80 * 0.0;
            local_1240._28_4_ = 0;
            auVar53 = vpsllw_avx(auVar53,0xf);
            auVar53 = vpacksswb_avx(auVar53,auVar53);
            uVar46 = (ulong)(byte)(SUB161(auVar53 >> 7,0) & 1 | (SUB161(auVar53 >> 0xf,0) & 1) << 1
                                   | (SUB161(auVar53 >> 0x17,0) & 1) << 2 |
                                   (SUB161(auVar53 >> 0x1f,0) & 1) << 3 |
                                   (SUB161(auVar53 >> 0x27,0) & 1) << 4 |
                                   (SUB161(auVar53 >> 0x2f,0) & 1) << 5 |
                                   (SUB161(auVar53 >> 0x37,0) & 1) << 6 |
                                  SUB161(auVar53 >> 0x3f,0) << 7);
            do {
              uVar47 = 0;
              for (uVar34 = uVar46; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x8000000000000000) {
                uVar47 = uVar47 + 1;
              }
              uVar36 = *(uint *)((long)&local_1400 + uVar47 * 4);
              pGVar13 = (pSVar11->geometries).items[uVar36].ptr;
              if ((pGVar13->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar13->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_005ebfd4:
                  *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                  return bVar52;
                }
                local_16c0 = auVar68._0_32_;
                uVar34 = (ulong)(uint)((int)uVar47 * 4);
                local_15e0 = *(undefined4 *)(local_12e0 + uVar34);
                uVar3 = *(undefined4 *)(local_12c0 + uVar34);
                local_15d0._4_4_ = uVar3;
                local_15d0._0_4_ = uVar3;
                local_15d0._8_4_ = uVar3;
                local_15d0._12_4_ = uVar3;
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)((long)local_12a0 + uVar34);
                local_16f0.context = context->user;
                local_15b0._4_4_ = uVar36;
                local_15b0._0_4_ = uVar36;
                local_15b0._8_4_ = uVar36;
                local_15b0._12_4_ = uVar36;
                uVar3 = *(undefined4 *)((long)&local_1420 + uVar34);
                local_15c0._4_4_ = uVar3;
                local_15c0._0_4_ = uVar3;
                local_15c0._8_4_ = uVar3;
                local_15c0._12_4_ = uVar3;
                uVar3 = *(undefined4 *)(local_1280 + uVar34);
                local_1610._4_4_ = uVar3;
                local_1610._0_4_ = uVar3;
                local_1610._8_4_ = uVar3;
                local_1610._12_4_ = uVar3;
                uVar3 = *(undefined4 *)(local_1260 + uVar34);
                local_1600._4_4_ = uVar3;
                local_1600._0_4_ = uVar3;
                local_1600._8_4_ = uVar3;
                local_1600._12_4_ = uVar3;
                uVar3 = *(undefined4 *)(local_1240 + uVar34);
                local_15f0._4_4_ = uVar3;
                local_15f0._0_4_ = uVar3;
                local_15f0._8_4_ = uVar3;
                local_15f0._12_4_ = uVar3;
                vpcmpeqd_avx2(ZEXT1632(local_15b0),ZEXT1632(local_15b0));
                uStack_159c = (local_16f0.context)->instID[0];
                local_15a0 = uStack_159c;
                uStack_1598 = uStack_159c;
                uStack_1594 = uStack_159c;
                uStack_1590 = (local_16f0.context)->instPrimID[0];
                uStack_158c = uStack_1590;
                uStack_1588 = uStack_1590;
                uStack_1584 = uStack_1590;
                local_1780 = *local_1768;
                local_16f0.valid = (int *)local_1780;
                local_16f0.geometryUserPtr = pGVar13->userPtr;
                local_16f0.hit = local_1610;
                local_16f0.N = 4;
                local_16f0.ray = (RTCRayN *)ray;
                uStack_15dc = local_15e0;
                uStack_15d8 = local_15e0;
                uStack_15d4 = local_15e0;
                if (pGVar13->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar13->occlusionFilterN)(&local_16f0);
                }
                if (local_1780 == (undefined1  [16])0x0) {
                  auVar53 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                  auVar53 = auVar53 ^ _DAT_01f7ae20;
                }
                else {
                  p_Var16 = context->args->filter;
                  if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar13->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    (*p_Var16)(&local_16f0);
                  }
                  auVar58 = vpcmpeqd_avx(local_1780,_DAT_01f7aa10);
                  auVar53 = auVar58 ^ _DAT_01f7ae20;
                  auVar61._8_4_ = 0xff800000;
                  auVar61._0_8_ = 0xff800000ff800000;
                  auVar61._12_4_ = 0xff800000;
                  auVar58 = vblendvps_avx(auVar61,*(undefined1 (*) [16])(local_16f0.ray + 0x80),
                                          auVar58);
                  *(undefined1 (*) [16])(local_16f0.ray + 0x80) = auVar58;
                }
                auVar58._8_8_ = 0x100000001;
                auVar58._0_8_ = 0x100000001;
                if ((auVar58 & auVar53) != (undefined1  [16])0x0) goto LAB_005ebfd4;
                auVar68 = ZEXT3264(local_16c0);
                *(int *)(ray + k * 4 + 0x80) = local_16c0._0_4_;
              }
              uVar46 = uVar46 ^ 1L << (uVar47 & 0x3f);
            } while (uVar46 != 0);
          }
        }
        local_1740 = local_1740 + 1;
      } while (local_1740 != local_1748);
    }
    bVar52 = local_1750 != &local_1200;
    auVar68 = ZEXT3264(local_1460);
    auVar70 = ZEXT3264(local_1480);
    auVar73 = ZEXT3264(local_14a0);
    auVar77 = ZEXT3264(local_14c0);
    auVar83 = ZEXT3264(local_14e0);
    auVar85 = ZEXT3264(local_1500);
    auVar95 = ZEXT3264(local_1520);
    auVar99 = ZEXT3264(local_1540);
    uVar46 = local_1758;
    uVar47 = local_1760;
joined_r0x005ebfb0:
    if (!bVar52) {
      return bVar52;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }